

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

Stats * __thiscall clunk::Stats::operator+=(Stats *this,Stats *other)

{
  uint64_t uVar1;
  
  this->statCount = this->statCount + 1;
  uVar1 = other->ttHits;
  this->ttGets = this->ttGets + other->ttGets;
  this->ttHits = this->ttHits + uVar1;
  uVar1 = other->ttStales;
  this->ttMates = other->ttMates + this->ttMates;
  this->ttStales = uVar1 + this->ttStales;
  uVar1 = other->ptHits;
  this->ptGets = other->ptGets + this->ptGets;
  this->ptHits = uVar1 + this->ptHits;
  uVar1 = other->qnodes;
  this->snodes = other->snodes + this->snodes;
  this->qnodes = uVar1 + this->qnodes;
  uVar1 = other->oneReplyExts;
  this->chkExts = this->chkExts + other->chkExts;
  this->oneReplyExts = this->oneReplyExts + uVar1;
  uVar1 = other->execs;
  this->hashExts = this->hashExts + other->hashExts;
  this->execs = this->execs + uVar1;
  uVar1 = other->deltaCount;
  this->qexecs = this->qexecs + other->qexecs;
  this->deltaCount = this->deltaCount + uVar1;
  uVar1 = other->rzrCount;
  this->staticNM = this->staticNM + other->staticNM;
  this->rzrCount = this->rzrCount + uVar1;
  uVar1 = other->rzrCutoffs;
  this->rzrEarlyOut = this->rzrEarlyOut + other->rzrEarlyOut;
  this->rzrCutoffs = this->rzrCutoffs + uVar1;
  uVar1 = other->nullMoves;
  this->iidCount = this->iidCount + other->iidCount;
  this->nullMoves = this->nullMoves + uVar1;
  uVar1 = other->nmrCandidates;
  this->nmCutoffs = this->nmCutoffs + other->nmCutoffs;
  this->nmrCandidates = this->nmrCandidates + uVar1;
  uVar1 = other->nmrBackfires;
  this->nmReductions = this->nmReductions + other->nmReductions;
  this->nmrBackfires = this->nmrBackfires + uVar1;
  uVar1 = other->lmCandidates;
  this->lateMoves = this->lateMoves + other->lateMoves;
  this->lmCandidates = this->lmCandidates + uVar1;
  uVar1 = other->lmResearches;
  this->lmReductions = this->lmReductions + other->lmReductions;
  this->lmResearches = this->lmResearches + uVar1;
  uVar1 = other->lmAlphaIncs;
  this->lmConfirmed = this->lmConfirmed + other->lmConfirmed;
  this->lmAlphaIncs = this->lmAlphaIncs + uVar1;
  return this;
}

Assistant:

Stats& Stats::operator+=(const Stats& other) {
  statCount     += 1;
  ttGets        += other.ttGets;
  ttHits        += other.ttHits;
  ttMates       += other.ttMates;
  ttStales      += other.ttStales;
  ptGets        += other.ptGets;
  ptHits        += other.ptHits;
  snodes        += other.snodes;
  qnodes        += other.qnodes;
  chkExts       += other.chkExts;
  oneReplyExts  += other.oneReplyExts;
  hashExts      += other.hashExts;
  execs         += other.execs;
  qexecs        += other.qexecs;
  deltaCount    += other.deltaCount;
  staticNM      += other.staticNM;
  rzrCount      += other.rzrCount;
  rzrEarlyOut   += other.rzrEarlyOut;
  rzrCutoffs    += other.rzrCutoffs;
  iidCount      += other.iidCount;
  nullMoves     += other.nullMoves;
  nmCutoffs     += other.nmCutoffs;
  nmrCandidates += other.nmrCandidates;
  nmReductions  += other.nmReductions;
  nmrBackfires  += other.nmrBackfires;
  lateMoves     += other.lateMoves;
  lmCandidates  += other.lmCandidates;
  lmReductions  += other.lmReductions;
  lmResearches  += other.lmResearches;
  lmConfirmed   += other.lmConfirmed;
  lmAlphaIncs   += other.lmAlphaIncs;
  return *this;
}